

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall MakefileGenerator::prlFileName(MakefileGenerator *this,bool fixify)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  byte in_DL;
  QMakeProject *in_RSI;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_000003ac;
  QStringBuilder<ProString,_QString_&> *in_stack_fffffffffffffe48;
  ProKey *in_stack_fffffffffffffe50;
  ProKey *this_00;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined1 in_stack_fffffffffffffef7;
  QString *in_stack_fffffffffffffef8;
  MakefileGenerator *in_stack_ffffffffffffff00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_ProString).m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_ProString).m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_ProString).m_string.d.size = -0x5555555555555556;
  ProKey::ProKey(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
  QMakeEvaluator::first(&in_RSI->super_QMakeEvaluator,in_RDI);
  ::operator+((ProString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
              (QString *)in_stack_fffffffffffffe50);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe48);
  QStringBuilder<ProString,_QString_&>::~QStringBuilder
            ((QStringBuilder<ProString,_QString_&> *)0x18643f);
  ProString::~ProString((ProString *)0x18644c);
  ProKey::~ProKey((ProKey *)0x186459);
  if ((in_DL & 1) != 0) {
    this_00 = (ProKey *)(in_RSI->super_QMakeEvaluator).m_superfile.d.size;
    ProKey::ProKey(this_00,(char *)in_stack_fffffffffffffe48);
    bVar2 = QMakeProject::isEmpty(in_RSI,in_RDI);
    bVar3 = bVar2 ^ 0xff;
    ProKey::~ProKey((ProKey *)0x1864ae);
    if ((bVar3 & 1) != 0) {
      in_stack_fffffffffffffe48 =
           (QStringBuilder<ProString,_QString_&> *)(in_RSI->super_QMakeEvaluator).m_superfile.d.size
      ;
      ProKey::ProKey(this_00,(char *)in_stack_fffffffffffffe48);
      QMakeEvaluator::first(&in_RSI->super_QMakeEvaluator,in_RDI);
      ProString::toQString(&in_stack_fffffffffffffe48->a);
      QString::prepend((QString *)this_00,(QString *)in_stack_fffffffffffffe48);
      QString::~QString((QString *)0x186526);
      ProString::~ProString((ProString *)0x186533);
      ProKey::~ProKey((ProKey *)0x18653d);
    }
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)this_00,
               (FileFixifyType)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    fileFixify(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (FileFixifyTypes)in_stack_000003ac.i,(bool)in_stack_fffffffffffffef7);
    QString::operator=((QString *)this_00,(QString *)in_stack_fffffffffffffe48);
    QString::~QString((QString *)0x186583);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::prlFileName(bool fixify)
{
    QString ret = project->first("PRL_TARGET") + Option::prl_ext;
    if(fixify) {
        if(!project->isEmpty("DESTDIR"))
            ret.prepend(project->first("DESTDIR").toQString());
        ret = fileFixify(ret, FileFixifyBackwards);
    }
    return ret;
}